

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

void despot::DESPOT::Update(QNode *qnode)

{
  VNode *this;
  bool bVar1;
  pointer ppVar2;
  double dVar3;
  VNode *vnode;
  _Self local_38;
  iterator it;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *children;
  double utility_upper;
  double upper;
  double lower;
  QNode *qnode_local;
  
  upper = qnode->step_reward;
  utility_upper = qnode->step_reward;
  children = (map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
              *)(qnode->step_reward + DAT_00278a80);
  it._M_node = (_Base_ptr)QNode::children(qnode);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
       ::begin((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                *)it._M_node);
  while( true ) {
    vnode = (VNode *)std::
                     map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                     ::end((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                            *)it._M_node);
    bVar1 = std::operator!=(&local_38,(_Self *)&vnode);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator->
                       (&local_38);
    this = ppVar2->second;
    dVar3 = VNode::lower_bound(this);
    upper = dVar3 + upper;
    dVar3 = VNode::upper_bound(this);
    utility_upper = dVar3 + utility_upper;
    children = (map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                *)(this->utility_upper_bound + (double)children);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator++
              (&local_38,0);
  }
  dVar3 = QNode::lower_bound(qnode);
  if (dVar3 < upper) {
    QNode::lower_bound(qnode,upper);
  }
  dVar3 = QNode::upper_bound(qnode);
  if (utility_upper < dVar3) {
    QNode::upper_bound(qnode,utility_upper);
  }
  if ((double)children < qnode->utility_upper_bound) {
    qnode->utility_upper_bound = (double)children;
  }
  return;
}

Assistant:

void DESPOT::Update(QNode* qnode) {
	double lower = qnode->step_reward;
	double upper = qnode->step_reward;
	double utility_upper = qnode->step_reward
		+ Globals::config.pruning_constant;

	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
		it != children.end(); it++) {
		VNode* vnode = it->second;

		lower += vnode->lower_bound();
		upper += vnode->upper_bound();
		utility_upper += vnode->utility_upper_bound;
	}

	if (lower > qnode->lower_bound()) {
		qnode->lower_bound(lower);
	}
	if (upper < qnode->upper_bound()) {
		qnode->upper_bound(upper);
	}
	if (utility_upper < qnode->utility_upper_bound) {
		qnode->utility_upper_bound = utility_upper;
	}
}